

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O3

LabelInstr * __thiscall
BasicBlock::CanProveConditionalBranch
          (BasicBlock *this,BranchInstr *branch,GlobOpt *globOpt,GlobHashTable *localSymToValueMap)

{
  IRKind IVar1;
  Opnd *opnd;
  code *pcVar2;
  bool bVar3;
  Value *val;
  Var src1Var;
  Value *val_00;
  Var src2Var;
  LabelInstr *pLVar4;
  undefined4 *puVar5;
  bool local_31 [8];
  bool provenTrue;
  
  val = GetValueForConditionalBranch
                  (this,branch,(branch->super_Instr).m_src1,globOpt,localSymToValueMap);
  if (val != (Value *)0x0) {
    src1Var = GlobOpt::GetConstantVar(globOpt,(branch->super_Instr).m_src1,val);
    opnd = (branch->super_Instr).m_src2;
    if (opnd == (Opnd *)0x0) {
      val_00 = (Value *)0x0;
      src2Var = (Var)0x0;
    }
    else {
      val_00 = GetValueForConditionalBranch(this,branch,opnd,globOpt,localSymToValueMap);
      if (val_00 == (Value *)0x0) {
        return (LabelInstr *)0x0;
      }
      src2Var = GlobOpt::GetConstantVar(globOpt,(branch->super_Instr).m_src2,val_00);
    }
    bVar3 = GlobOpt::CanProveConditionalBranch
                      (globOpt,&branch->super_Instr,val,val_00,src1Var,src2Var,local_31);
    if (bVar3) {
      if (local_31[0] == true) {
        return branch->m_branchTarget;
      }
      pLVar4 = (LabelInstr *)IR::Instr::GetNextRealInstrOrLabel(&branch->super_Instr);
      IVar1 = (pLVar4->super_Instr).m_kind;
      if (IVar1 == InstrKindLabel) {
        return pLVar4;
      }
      if (IVar1 == InstrKindProfiledLabel) {
        return pLVar4;
      }
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0x7a,"(this->IsLabelInstr())","Bad call to AsLabelInstr()");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar5 = 0;
      return pLVar4;
    }
  }
  return (LabelInstr *)0x0;
}

Assistant:

IR::LabelInstr* BasicBlock::CanProveConditionalBranch(IR::BranchInstr *branch, GlobOpt *globOpt, GlobHashTable *localSymToValueMap)
{
    Value *src1Val = nullptr, *src2Val = nullptr;
    Js::Var src1Var = nullptr, src2Var = nullptr;

    src1Val = GetValueForConditionalBranch(branch, branch->GetSrc1(), globOpt, localSymToValueMap);
    if (!src1Val)
    {
        return nullptr;
    }
    src1Var = globOpt->GetConstantVar(branch->GetSrc1(), src1Val);

    if (branch->GetSrc2() != nullptr)
    {
        src2Val = GetValueForConditionalBranch(branch, branch->GetSrc2(), globOpt, localSymToValueMap);
        if (!src2Val)
        {
            return nullptr;
        }
        src2Var = globOpt->GetConstantVar(branch->GetSrc2(), src2Val);
    }

    bool provenTrue;
    if (!globOpt->CanProveConditionalBranch(branch, src1Val, src2Val, src1Var, src2Var, &provenTrue))
    {
        return nullptr;
    }

    IR::LabelInstr * newTarget = provenTrue ? branch->GetTarget() : branch->GetNextRealInstrOrLabel()->AsLabelInstr();

    return newTarget;
}